

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O3

void predict_or_learn_adaptive<false>(boosting *o,single_learner *base,example *ec)

{
  float fVar1;
  uint64_t uVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float local_44;
  
  fVar1 = ec->weight;
  local_44 = 0.0;
  if ((float)o->t < 0.0) {
    sqrtf((float)o->t);
  }
  fVar4 = merand48(&o->all->random_state);
  if (0 < o->N) {
    uVar2 = (ec->super_example_predict).ft_offset;
    local_44 = 0.0;
    lVar3 = 0;
    fVar5 = 0.0;
    do {
      (ec->super_example_predict).ft_offset = (uint)(*(int *)(base + 0xe0) * (int)lVar3) + uVar2;
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      uVar2 = (ec->super_example_predict).ft_offset -
              (ulong)(uint)(*(int *)(base + 0xe0) * (int)lVar3);
      (ec->super_example_predict).ft_offset = uVar2;
      if (fVar4 < fVar5) break;
      fVar5 = fVar5 + (o->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar3];
      local_44 = local_44 +
                 (ec->pred).scalar *
                 (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 < o->N);
  }
  ec->weight = fVar1;
  ec->partial_prediction = local_44;
  fVar4 = *(float *)(&DAT_00278bc8 + (ulong)(0.0 < local_44) * 4);
  (ec->pred).scalar = fVar4;
  ec->loss = (float)(~-(uint)(fVar4 == (ec->l).simple.label) & (uint)fVar1);
  return;
}

Assistant:

void predict_or_learn_adaptive(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0, partial_prediction = 0;

  float s = 0;
  float v_normalization = 0, v_partial_sum = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;
  float eta = 4.f / (float)sqrtf((float)o.t);

  float stopping_point = merand48(o.all->random_state);

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float w = 1 / (1 + correctedExp(s));

      ec.weight = u * w;

      base.predict(ec, i);
      float z;

      z = ld.label * ec.pred.scalar;

      s += z * o.alpha[i];

      if (v_partial_sum <= stopping_point)
      {
        final_prediction += ec.pred.scalar * o.alpha[i];
      }

      partial_prediction += ec.pred.scalar * o.alpha[i];

      v_partial_sum += o.v[i];

      // update v, exp(-1) = 0.36788
      if (ld.label * partial_prediction < 0)
      {
        o.v[i] *= 0.36788f;
      }
      v_normalization += o.v[i];

      // update alpha
      o.alpha[i] += eta * z / (1 + correctedExp(s));
      if (o.alpha[i] > 2.)
        o.alpha[i] = 2;
      if (o.alpha[i] < -2.)
        o.alpha[i] = -2;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      if (v_partial_sum <= stopping_point)
      {
        final_prediction += ec.pred.scalar * o.alpha[i];
      }
      else
      {
        // stopping at learner i
        break;
      }
      v_partial_sum += o.v[i];
    }
  }

  // normalize v vector in training
  if (is_learn)
  {
    for (int i = 0; i < o.N; i++)
    {
      if (v_normalization)
        o.v[i] /= v_normalization;
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}